

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  cmExportSet *pcVar1;
  cmMakefile *this_00;
  cmInstallExportGenerator *pcVar2;
  pointer pcVar3;
  cmTarget *target;
  _Alloc_hider __s1;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  PolicyStatus PVar7;
  uint uVar8;
  undefined8 *puVar9;
  char *pcVar10;
  ostream *poVar11;
  long *plVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined7 uVar15;
  ostream *poVar14;
  size_type *psVar16;
  uint uVar17;
  char *versionString;
  char cVar18;
  undefined8 uVar19;
  ulong uVar20;
  uint uVar21;
  cmExportInstallFileGenerator *pcVar22;
  pointer ppcVar23;
  pointer config;
  bool bVar24;
  pair<std::_Rb_tree_iterator<cmTarget_*>,_bool> pVar25;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  string installPrefix;
  cmTargetExport *te;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  cmExportInstallFileGenerator *local_258;
  ostream *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  uint local_220;
  uint local_21c;
  _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
  *local_218;
  string local_210;
  undefined1 local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  iterator iStack_1c0;
  cmTargetExport **local_1b8;
  uint local_1ac;
  undefined1 local_1a8 [32];
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  iStack_1c0._M_current = (cmTargetExport **)0x0;
  local_1b8 = (cmTargetExport **)0x0;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->IEGen->ExportSet;
  ppcVar23 = (pcVar1->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar24 = ppcVar23 ==
           (pcVar1->TargetExports).
           super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_258 = this;
  local_250 = os;
  if (!bVar24) {
    local_1d0 = &(this->super_cmExportFileGenerator).Namespace;
    local_218 = (_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                 *)&(this->super_cmExportFileGenerator).ExportedTargets;
    do {
      std::operator+(&local_248,&local_278,local_1d0);
      cmTarget::GetExportName_abi_cxx11_((string *)local_1f0,(*ppcVar23)->Target);
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        uVar19 = local_248.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_248._M_string_length + local_1f0._8_8_) {
        uVar20 = 0xf;
        if ((cmTargetExport *)local_1f0._0_8_ != (cmTargetExport *)(local_1f0 + 0x10)) {
          uVar20 = local_1f0._16_8_;
        }
        if (uVar20 < local_248._M_string_length + local_1f0._8_8_) goto LAB_003b6bab;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)local_1f0,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
      }
      else {
LAB_003b6bab:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,local_1f0._0_8_);
      }
      psVar16 = puVar9 + 2;
      if ((size_type *)*puVar9 == psVar16) {
        local_1a8._16_8_ = *psVar16;
        local_1a8._24_8_ = puVar9[3];
        local_1a8._0_8_ = local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *psVar16;
        local_1a8._0_8_ = (size_type *)*puVar9;
      }
      local_1a8._8_8_ = puVar9[1];
      *puVar9 = psVar16;
      puVar9[1] = 0;
      *(char *)psVar16 = '\0';
      std::__cxx11::string::_M_append((char *)&local_210,local_1a8._0_8_);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((cmTargetExport *)local_1f0._0_8_ != (cmTargetExport *)(local_1f0 + 0x10)) {
        operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_278,0,(char *)local_278._M_string_length,0x4f29fe);
      local_1f0._0_8_ = *ppcVar23;
      pVar25 = std::
               _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
               ::_M_insert_unique<cmTarget*const&>(local_218,(cmTarget **)local_1f0._0_8_);
      if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"install(EXPORT \"",0x10);
        pcVar1 = local_258->IEGen->ExportSet;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(pcVar1->Name)._M_dataplus._M_p,
                             (pcVar1->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ...) ",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"includes target \"",0x11);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,((*(cmTarget **)local_1f0._0_8_)->Name)._M_dataplus._M_p,
                             ((*(cmTarget **)local_1f0._0_8_)->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"\" more than once in the export set.",0x23);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Error(local_248._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else if (iStack_1c0._M_current == local_1b8) {
        std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>::
        _M_realloc_insert<cmTargetExport*const&>
                  ((vector<cmTargetExport*,std::allocator<cmTargetExport*>> *)&local_1c8,iStack_1c0,
                   (cmTargetExport **)local_1f0);
      }
      else {
        *iStack_1c0._M_current = (cmTargetExport *)local_1f0._0_8_;
        iStack_1c0._M_current = iStack_1c0._M_current + 1;
      }
      if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                                   local_210.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_003b6fa4;
      }
      ppcVar23 = ppcVar23 + 1;
      bVar24 = ppcVar23 ==
               (local_258->IEGen->ExportSet->TargetExports).
               super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (!bVar24);
  }
  pcVar22 = local_258;
  cmExportFileGenerator::GenerateExpectedTargetsCode
            (&local_258->super_cmExportFileGenerator,local_250,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
  if (bVar24) {
    this_00 = pcVar22->IEGen->Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_INSTALL_PREFIX","");
    pcVar10 = cmMakefile::GetSafeDefinition(this_00,(string *)local_1a8);
    std::__cxx11::string::string((string *)&local_210,pcVar10,(allocator *)&local_278);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar2 = pcVar22->IEGen;
    bVar24 = cmsys::SystemTools::FileIsFullPath(&(pcVar2->super_cmInstallGenerator).Destination);
    if (bVar24) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_250,
                 "# The installation prefix configured by this project.\nset(_IMPORT_PREFIX \"",0x4a
                );
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_250,local_210._M_dataplus._M_p,local_210._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\")\n\n",4);
    }
    else {
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_210._M_dataplus._M_p,
                 local_210._M_dataplus._M_p + local_210._M_string_length);
      std::__cxx11::string::append((char *)&local_278);
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_278,
                                   (ulong)(pcVar2->super_cmInstallGenerator).Destination._M_dataplus
                                          ._M_p);
      local_1a8._0_8_ = local_1a8 + 0x10;
      psVar16 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar16) {
        local_1a8._16_8_ = *psVar16;
        local_1a8._24_8_ = plVar12[3];
      }
      else {
        local_1a8._16_8_ = *psVar16;
        local_1a8._0_8_ = (size_type *)*plVar12;
      }
      local_1a8._8_8_ = plVar12[1];
      *plVar12 = (long)psVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                 local_278.field_2._M_local_buf[0]) + 1);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_1a8._0_8_,(char *)(local_1a8._0_8_ + local_1a8._8_8_));
      std::__cxx11::string::append((char *)&local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_250,"# Compute the installation prefix relative to this file.\n",0x39);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_250,"get_filename_component(_IMPORT_PREFIX",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_250," \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n",0x24);
      __s1._M_p = local_278._M_dataplus._M_p;
      iVar5 = strncmp(local_278._M_dataplus._M_p,"/lib/",5);
      if ((((iVar5 == 0) || (iVar5 = strncmp(__s1._M_p,"/lib64/",7), iVar5 == 0)) ||
          (iVar5 = strncmp(__s1._M_p,"/usr/lib/",9), iVar5 == 0)) ||
         (iVar5 = strncmp(__s1._M_p,"/usr/lib64/",0xb), iVar5 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_250,
                   "# Use original install prefix when loaded through a\n# cross-prefix symbolic link such as /lib -> /usr/lib.\nget_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\nget_filename_component(_realOrig \""
                   ,0xcc);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_250,(char *)local_1a8._0_8_,local_1a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"\" REALPATH)\nif(_realCurr STREQUAL _realOrig)\n  set(_IMPORT_PREFIX \""
                   ,0x43);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(char *)local_1a8._0_8_,local_1a8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"\")\nendif()\nunset(_realOrig)\nunset(_realCurr)\n",0x2d);
      }
      pcVar3 = (pcVar2->super_cmInstallGenerator).Destination._M_dataplus._M_p;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar3,
                 pcVar3 + (pcVar2->super_cmInstallGenerator).Destination._M_string_length);
      if (local_248._M_string_length != 0) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_250,"get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n"
                     ,0x40);
          cmsys::SystemTools::GetFilenamePath((string *)local_1f0,&local_248);
          std::__cxx11::string::operator=((string *)&local_248,(string *)local_1f0);
          if ((cmTargetExport *)local_1f0._0_8_ != (cmTargetExport *)(local_1f0 + 0x10)) {
            operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
          }
        } while (local_248._M_string_length != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_250,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      pcVar22 = local_258;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                 local_278.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    local_248._M_dataplus._M_p = (char *)0x0;
    local_248._M_string_length = 0;
    local_248.field_2._M_allocated_capacity = 0;
    if (local_1c8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iStack_1c0._M_current)
    {
      uVar8 = 0;
      uVar17 = 0;
      uVar21 = 0;
      cVar18 = '\0';
    }
    else {
      local_218 = (_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                   *)((ulong)local_218 & 0xffffffff00000000);
      uVar21 = 0;
      local_21c = 0;
      local_220 = 0;
      pbVar13 = local_1c8;
      do {
        pcVar22 = local_258;
        pcVar3 = (pbVar13->_M_dataplus)._M_p;
        target = *(cmTarget **)pcVar3;
        uVar15 = (undefined7)((ulong)pcVar3 >> 8);
        uVar6 = (undefined4)CONCAT71(uVar15,1);
        if (((ulong)local_218 & 1) == 0) {
          uVar6 = (undefined4)CONCAT71(uVar15,target->TargetTypeValue != INTERFACE_LIBRARY);
        }
        local_218 = (_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                     *)CONCAT44(local_218._4_4_,uVar6);
        local_1d0 = pbVar13;
        local_1ac = uVar21;
        cmExportFileGenerator::GenerateImportTargetCode
                  (&local_258->super_cmExportFileGenerator,local_250,target);
        pbVar13 = local_1d0;
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
        local_1a8._16_8_ = 0;
        local_1a8._24_8_ = local_1a8 + 8;
        local_180 = 0;
        local_188 = (_Base_ptr)local_1a8._24_8_;
        cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                  (&pcVar22->super_cmExportFileGenerator,
                   (cmTargetExport *)(local_1d0->_M_dataplus)._M_p,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        cmExportFileGenerator::PopulateSourcesInterface
                  (&pcVar22->super_cmExportFileGenerator,
                   (cmTargetExport *)(pbVar13->_M_dataplus)._M_p,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,target,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        uVar21 = local_1ac;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_COMPILE_DEFINITIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,target,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,target,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,target,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,target,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        PVar7 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022);
        if (((PVar7 != WARN) &&
            (PVar7 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022), PVar7 != OLD)) &&
           ((bVar24 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                                (&local_258->super_cmExportFileGenerator,target,InstallInterface,
                                 (ImportPropertyMap *)local_1a8,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_248), bVar24 &&
            (local_220 = local_220 & 0xff,
            (local_258->super_cmExportFileGenerator).ExportOld == false)))) {
          local_220 = 1;
        }
        local_21c = local_21c & 0xff;
        if (target->TargetTypeValue == INTERFACE_LIBRARY) {
          local_21c = 1;
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"INTERFACE_SOURCES","")
        ;
        pcVar10 = cmTarget::GetProperty(target,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        uVar21 = uVar21 & 0xff;
        if (pcVar10 != (char *)0x0) {
          uVar21 = 1;
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_POSITION_INDEPENDENT_CODE","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,target,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                  (&local_258->super_cmExportFileGenerator,target,(ImportPropertyMap *)local_1a8);
        cmExportFileGenerator::GenerateInterfaceProperties
                  (&local_258->super_cmExportFileGenerator,target,local_250,
                   (ImportPropertyMap *)local_1a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1a8);
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &local_1d0->_M_string_length;
      } while (pbVar13 !=
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               iStack_1c0._M_current);
      pcVar22 = local_258;
      uVar8 = local_220;
      uVar17 = local_21c;
      cVar18 = (char)local_218;
    }
    poVar11 = local_250;
    if ((((uVar21 & 1) != 0) || ((uVar17 & 1) != 0)) || ((uVar8 & 1) != 0)) {
      pcVar10 = "2.8.12";
      if ((uVar17 & 1) != 0) {
        pcVar10 = "3.0.0";
      }
      versionString = "3.1.0";
      if ((uVar21 & 1) == 0) {
        versionString = pcVar10;
      }
      cmExportFileGenerator::GenerateRequiredCMakeVersion
                (&pcVar22->super_cmExportFileGenerator,local_250,versionString);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"# Load information for each installed configuration.\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"file(GLOB CONFIG_FILES \"${_DIR}/",0x20);
    GetConfigImportFileGlob_abi_cxx11_((string *)local_1a8,pcVar22);
    poVar11 = local_250;
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_250,(char *)local_1a8._0_8_,local_1a8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\")\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"foreach(f ${CONFIG_FILES})\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"  include(${f})\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"endforeach()\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"# Cleanup temporary variables.\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"set(_IMPORT_PREFIX)\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    cmExportFileGenerator::GenerateImportedFileCheckLoop
              (&pcVar22->super_cmExportFileGenerator,poVar11);
    poVar11 = local_250;
    bVar24 = true;
    if ((cVar18 != '\0') &&
       (config = (pcVar22->super_cmExportFileGenerator).Configurations.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       config != (pcVar22->super_cmExportFileGenerator).Configurations.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      bVar24 = true;
      do {
        bVar4 = GenerateImportFileConfig
                          (pcVar22,config,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_248);
        if (!bVar4) {
          bVar24 = false;
        }
        config = config + 1;
      } while (config != (pcVar22->super_cmExportFileGenerator).Configurations.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmExportFileGenerator::GenerateMissingTargetsCheckCode
              (&pcVar22->super_cmExportFileGenerator,poVar11,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                               local_210.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
LAB_003b6fa4:
    bVar24 = false;
  }
  if (local_1c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
  }
  return bVar24;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
  std::string expectedTargets;
  std::string sep;
  for(std::vector<cmTargetExport*>::const_iterator
        tei = this->IEGen->GetExportSet()->GetTargetExports()->begin();
      tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei)
    {
    expectedTargets += sep + this->Namespace + (*tei)->Target->GetExportName();
    sep = " ";
    cmTargetExport * te = *tei;
    if(this->ExportedTargets.insert(te->Target).second)
      {
      allTargets.push_back(te);
      }
    else
      {
      std::ostringstream e;
      e << "install(EXPORT \""
        << this->IEGen->GetExportSet()->GetName()
        << "\" ...) " << "includes target \"" << te->Target->GetName()
        << "\" more than once in the export set.";
      cmSystemTools::Error(e.str().c_str());
      return false;
      }
    }

  this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Set an _IMPORT_PREFIX variable for import location properties
  // to reference if they are relative to the install prefix.
  std::string installPrefix =
    this->IEGen->GetMakefile()->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  std::string const& expDest = this->IEGen->GetDestination();
  if(cmSystemTools::FileIsFullPath(expDest))
    {
    // The export file is being installed to an absolute path so the
    // package is not relocatable.  Use the configured install prefix.
    os <<
      "# The installation prefix configured by this project.\n"
      "set(_IMPORT_PREFIX \"" << installPrefix << "\")\n"
      "\n";
    }
  else
    {
    // Add code to compute the installation prefix relative to the
    // import file location.
    std::string absDest = installPrefix + "/" + expDest;
    std::string absDestS = absDest + "/";
    os << "# Compute the installation prefix relative to this file.\n"
       << "get_filename_component(_IMPORT_PREFIX"
       << " \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n";
    if(cmHasLiteralPrefix(absDestS.c_str(), "/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/lib64/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib64/"))
      {
      // Handle "/usr move" symlinks created by some Linux distros.
      os <<
        "# Use original install prefix when loaded through a\n"
        "# cross-prefix symbolic link such as /lib -> /usr/lib.\n"
        "get_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\n"
        "get_filename_component(_realOrig \"" << absDest << "\" REALPATH)\n"
        "if(_realCurr STREQUAL _realOrig)\n"
        "  set(_IMPORT_PREFIX \"" << absDest << "\")\n"
        "endif()\n"
        "unset(_realOrig)\n"
        "unset(_realCurr)\n";
      }
    std::string dest = expDest;
    while(!dest.empty())
      {
      os <<
        "get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n";
      dest = cmSystemTools::GetFilenamePath(dest);
      }
    os << "\n";
    }

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for(std::vector<cmTargetExport*>::const_iterator
        tei = allTargets.begin();
      tei != allTargets.end(); ++tei)
    {
    cmTarget* te = (*tei)->Target;

    requiresConfigFiles = requiresConfigFiles
                              || te->GetType() != cmTarget::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, te);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateSourcesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);

    const bool newCMP0022Behavior =
                              te->GetPolicyStatusCMP0022() != cmPolicies::WARN
                           && te->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior)
      {
      if (this->PopulateInterfaceLinkLibrariesProperty(te,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets)
          && !this->ExportOld)
        {
        require2_8_12 = true;
        }
      }
    if (te->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      require3_0_0 = true;
      }
    if(te->GetProperty("INTERFACE_SOURCES"))
      {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
      }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE",
                                  te, properties);
    this->PopulateCompatibleInterfaceProperties(te, properties);

    this->GenerateInterfaceProperties(te, os, properties);
    }

  if (require3_1_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
    }
  else if (require3_0_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
    }
  else if (require2_8_12)
    {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
    }

  // Now load per-configuration properties for them.
  os << "# Load information for each installed configuration.\n"
     << "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n"
     << "file(GLOB CONFIG_FILES \"${_DIR}/"
     << this->GetConfigImportFileGlob() << "\")\n"
     << "foreach(f ${CONFIG_FILES})\n"
     << "  include(${f})\n"
     << "endforeach()\n"
     << "\n";

  // Cleanup the import prefix variable.
  os << "# Cleanup temporary variables.\n"
     << "set(_IMPORT_PREFIX)\n"
     << "\n";
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles)
    {
    for(std::vector<std::string>::const_iterator
          ci = this->Configurations.begin();
        ci != this->Configurations.end(); ++ci)
      {
      if(!this->GenerateImportFileConfig(*ci, missingTargets))
        {
        result = false;
        }
      }
    }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}